

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool el::Logger::isValidId(string *id)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (id->_M_string_length == 0) {
    return true;
  }
  pcVar3 = (id->_M_dataplus)._M_p;
  pcVar2 = pcVar3 + id->_M_string_length;
  do {
    pcVar4 = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789-._";
    do {
      cVar1 = *pcVar4;
      if (cVar1 == *pcVar3) break;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
    if ((cVar1 == '\0') || (pcVar3 = pcVar3 + 1, pcVar3 == pcVar2)) {
      return cVar1 != '\0';
    }
  } while( true );
}

Assistant:

bool Logger::isValidId(const std::string& id) {
  for (std::string::const_iterator it = id.begin(); it != id.end(); ++it) {
    if (!base::utils::Str::contains(base::consts::kValidLoggerIdSymbols, *it)) {
      return false;
    }
  }
  return true;
}